

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O1

bool embree::avx2::ConeCurveMiIntersectorK<8,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *line)

{
  undefined4 uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  bool bVar53;
  bool bVar54;
  bool bVar55;
  bool bVar56;
  ulong uVar57;
  long lVar58;
  ulong uVar59;
  Scene *pSVar60;
  undefined1 auVar61 [8];
  bool bVar62;
  bool bVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  float fVar79;
  float fVar88;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar86;
  float fVar87;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  float fVar92;
  float fVar95;
  float fVar97;
  float fVar99;
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar93 [32];
  float fVar96;
  float fVar98;
  float fVar100;
  undefined1 auVar94 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  float fVar116;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar117;
  float fVar118;
  float fVar125;
  float fVar127;
  float fVar129;
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar126;
  float fVar128;
  float fVar130;
  undefined1 auVar124 [64];
  float fVar136;
  float fVar137;
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  float fVar156;
  float fVar158;
  float fVar159;
  undefined1 auVar157 [32];
  float fVar160;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar161 [32];
  undefined1 auVar162 [64];
  float fVar169;
  float fVar172;
  float fVar173;
  float fVar174;
  undefined1 auVar170 [32];
  undefined1 auVar171 [64];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  float fVar177;
  float fVar179;
  float fVar180;
  float fVar181;
  undefined1 auVar178 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<8> hit;
  undefined8 local_630;
  undefined8 uStack_628;
  size_t local_620;
  Scene *local_618;
  RTCFilterFunctionNArguments local_610;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  Primitive *local_5a8;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [16];
  undefined1 auStack_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 auStack_4b0 [16];
  RTCHitN local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  uint local_430;
  uint uStack_42c;
  uint uStack_428;
  uint uStack_424;
  uint local_420;
  uint uStack_41c;
  uint uStack_418;
  uint uStack_414;
  uint uStack_410;
  uint uStack_40c;
  uint uStack_408;
  uint uStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  undefined1 auStack_2b0 [8];
  float fStack_2a8;
  undefined4 uStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined4 uStack_1a4;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  uint local_180 [4];
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [32];
  
  pSVar60 = context->scene;
  local_180[0] = line->sharedGeomID;
  uVar4 = (line->v0).field_0.i[0];
  pGVar12 = (pSVar60->geometries).items[local_180[0]].ptr;
  lVar58 = *(long *)&pGVar12[1].time_range.upper;
  p_Var13 = pGVar12[1].intersectionFilterN;
  uVar5 = (line->v0).field_0.i[1];
  uVar6 = (line->v0).field_0.i[2];
  uVar7 = (line->v0).field_0.i[4];
  auVar65._16_16_ = *(undefined1 (*) [16])(lVar58 + (ulong)uVar7 * (long)p_Var13);
  auVar65._0_16_ = *(undefined1 (*) [16])(lVar58 + (ulong)uVar4 * (long)p_Var13);
  uVar8 = (line->v0).field_0.i[3];
  uVar9 = (line->v0).field_0.i[5];
  auVar73._16_16_ = *(undefined1 (*) [16])(lVar58 + (ulong)uVar9 * (long)p_Var13);
  auVar73._0_16_ = *(undefined1 (*) [16])(lVar58 + (ulong)uVar5 * (long)p_Var13);
  uVar10 = (line->v0).field_0.i[6];
  auVar82._16_16_ = *(undefined1 (*) [16])(lVar58 + (ulong)uVar10 * (long)p_Var13);
  auVar82._0_16_ = *(undefined1 (*) [16])(lVar58 + (ulong)uVar6 * (long)p_Var13);
  uVar11 = (line->v0).field_0.i[7];
  auVar93._16_16_ = *(undefined1 (*) [16])(lVar58 + (ulong)uVar11 * (long)p_Var13);
  auVar93._0_16_ = *(undefined1 (*) [16])(lVar58 + (ulong)uVar8 * (long)p_Var13);
  auVar64 = *(undefined1 (*) [16])(lVar58 + (ulong)(uVar7 + 1) * (long)p_Var13);
  auVar134._0_16_ =
       ZEXT116(0) * auVar64 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar58 + (ulong)(uVar4 + 1) * (long)p_Var13);
  auVar134._16_16_ = ZEXT116(1) * auVar64;
  auVar64 = *(undefined1 (*) [16])(lVar58 + (ulong)(uVar9 + 1) * (long)p_Var13);
  auVar75._0_16_ =
       ZEXT116(0) * auVar64 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar58 + (ulong)(uVar5 + 1) * (long)p_Var13);
  auVar75._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar64;
  auVar64 = *(undefined1 (*) [16])(lVar58 + (ulong)(uVar10 + 1) * (long)p_Var13);
  auVar110._0_16_ =
       ZEXT116(0) * auVar64 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar58 + (ulong)(uVar6 + 1) * (long)p_Var13);
  auVar110._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar64;
  auVar64 = *(undefined1 (*) [16])(lVar58 + (ulong)(uVar11 + 1) * (long)p_Var13);
  auVar119._0_16_ =
       ZEXT116(0) * auVar64 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar58 + (ulong)(uVar8 + 1) * (long)p_Var13);
  auVar119._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar64;
  auVar14 = vunpcklps_avx(auVar65,auVar82);
  auVar78 = vunpckhps_avx(auVar65,auVar82);
  auVar15 = vunpcklps_avx(auVar73,auVar93);
  auVar94 = vunpckhps_avx(auVar73,auVar93);
  auVar74 = vunpcklps_avx(auVar14,auVar15);
  auVar14 = vunpckhps_avx(auVar14,auVar15);
  auVar104 = vunpcklps_avx(auVar78,auVar94);
  auVar15 = vunpckhps_avx(auVar78,auVar94);
  auVar82 = vpunpckldq_avx2(auVar134,auVar110);
  auVar94 = vpunpckhdq_avx2(auVar134,auVar110);
  auVar93 = vpunpckldq_avx2(auVar75,auVar119);
  auVar73 = vpunpckhdq_avx2(auVar75,auVar119);
  auVar75 = vpunpckldq_avx2(auVar82,auVar93);
  uVar2 = line->leftExists;
  uVar3 = line->rightExists;
  auVar78 = vpcmpeqd_avx2(auVar134,auVar134);
  auVar65 = vpcmpeqd_avx2(auVar78,(undefined1  [32])(line->primIDs).field_0);
  local_180[1] = local_180[0];
  local_180[2] = local_180[0];
  local_180[3] = local_180[0];
  uStack_170 = local_180[0];
  uStack_16c = local_180[0];
  uStack_168 = local_180[0];
  uStack_164 = local_180[0];
  fVar140 = *(float *)(ray + k * 4 + 0x40);
  local_5e0._4_4_ = fVar140;
  local_5e0._0_4_ = fVar140;
  fStack_5d8 = fVar140;
  fStack_5d4 = fVar140;
  fStack_5d0 = fVar140;
  fStack_5cc = fVar140;
  fStack_5c8 = fVar140;
  fStack_5c4 = fVar140;
  fVar147 = *(float *)(ray + k * 4 + 0x50);
  local_1a0._4_4_ = fVar147;
  local_1a0._0_4_ = fVar147;
  fStack_198 = fVar147;
  fStack_194 = fVar147;
  fStack_190 = fVar147;
  fStack_18c = fVar147;
  fStack_188 = fVar147;
  register0x000015dc = fVar147;
  fVar150 = *(float *)(ray + k * 4 + 0x60);
  auVar82 = vpunpckhdq_avx2(auVar82,auVar93);
  auVar64 = vfmadd231ps_fma(ZEXT432((uint)(fVar150 * fVar150)),_local_1a0,_local_1a0);
  auVar64 = vfmadd231ps_fma(ZEXT1632(auVar64),_local_5e0,_local_5e0);
  auVar105._0_4_ = auVar64._0_4_;
  auVar105._4_4_ = auVar105._0_4_;
  auVar105._8_4_ = auVar105._0_4_;
  auVar105._12_4_ = auVar105._0_4_;
  auVar105._16_4_ = auVar105._0_4_;
  auVar105._20_4_ = auVar105._0_4_;
  auVar105._24_4_ = auVar105._0_4_;
  auVar105._28_4_ = auVar105._0_4_;
  auVar78 = vrcpps_avx(auVar105);
  auVar93 = vpunpckldq_avx2(auVar94,auVar73);
  auVar73 = vpunpckhdq_avx2(auVar94,auVar73);
  auVar66._8_4_ = 0x3f800000;
  auVar66._0_8_ = &DAT_3f8000003f800000;
  auVar66._12_4_ = 0x3f800000;
  auVar66._16_4_ = 0x3f800000;
  auVar66._20_4_ = 0x3f800000;
  auVar66._24_4_ = 0x3f800000;
  auVar66._28_4_ = 0x3f800000;
  auVar64 = vfnmadd213ps_fma(auVar105,auVar78,auVar66);
  auVar64 = vfmadd132ps_fma(ZEXT1632(auVar64),auVar78,auVar78);
  auVar20._4_4_ = (auVar75._4_4_ + auVar74._4_4_) * 0.5;
  auVar20._0_4_ = (auVar75._0_4_ + auVar74._0_4_) * 0.5;
  auVar20._8_4_ = (auVar75._8_4_ + auVar74._8_4_) * 0.5;
  auVar20._12_4_ = (auVar75._12_4_ + auVar74._12_4_) * 0.5;
  auVar20._16_4_ = (auVar75._16_4_ + auVar74._16_4_) * 0.5;
  auVar20._20_4_ = (auVar75._20_4_ + auVar74._20_4_) * 0.5;
  auVar20._24_4_ = (auVar75._24_4_ + auVar74._24_4_) * 0.5;
  auVar20._28_4_ = auVar75._28_4_ + auVar74._28_4_;
  auVar78._4_4_ = (auVar14._4_4_ + auVar82._4_4_) * 0.5;
  auVar78._0_4_ = (auVar14._0_4_ + auVar82._0_4_) * 0.5;
  auVar78._8_4_ = (auVar14._8_4_ + auVar82._8_4_) * 0.5;
  auVar78._12_4_ = (auVar14._12_4_ + auVar82._12_4_) * 0.5;
  auVar78._16_4_ = (auVar14._16_4_ + auVar82._16_4_) * 0.5;
  auVar78._20_4_ = (auVar14._20_4_ + auVar82._20_4_) * 0.5;
  auVar78._24_4_ = (auVar14._24_4_ + auVar82._24_4_) * 0.5;
  auVar78._28_4_ = auVar14._28_4_ + auVar82._28_4_;
  auVar94._4_4_ = (auVar104._4_4_ + auVar93._4_4_) * 0.5;
  auVar94._0_4_ = (auVar104._0_4_ + auVar93._0_4_) * 0.5;
  auVar94._8_4_ = (auVar104._8_4_ + auVar93._8_4_) * 0.5;
  auVar94._12_4_ = (auVar104._12_4_ + auVar93._12_4_) * 0.5;
  auVar94._16_4_ = (auVar104._16_4_ + auVar93._16_4_) * 0.5;
  auVar94._20_4_ = (auVar104._20_4_ + auVar93._20_4_) * 0.5;
  auVar94._24_4_ = (auVar104._24_4_ + auVar93._24_4_) * 0.5;
  auVar94._28_4_ = 0x3f000000;
  fVar79 = *(float *)(ray + k * 4 + 0x10);
  auVar141._4_4_ = fVar79;
  auVar141._0_4_ = fVar79;
  auVar141._8_4_ = fVar79;
  auVar141._12_4_ = fVar79;
  auVar141._16_4_ = fVar79;
  auVar141._20_4_ = fVar79;
  auVar141._24_4_ = fVar79;
  auVar141._28_4_ = fVar79;
  auVar78 = vsubps_avx(auVar78,auVar141);
  fVar86 = *(float *)(ray + k * 4 + 0x20);
  auVar154._4_4_ = fVar86;
  auVar154._0_4_ = fVar86;
  auVar154._8_4_ = fVar86;
  auVar154._12_4_ = fVar86;
  auVar154._16_4_ = fVar86;
  auVar154._20_4_ = fVar86;
  auVar154._24_4_ = fVar86;
  auVar154._28_4_ = fVar86;
  auVar94 = vsubps_avx(auVar94,auVar154);
  auVar21._4_4_ = fVar150 * auVar94._4_4_;
  auVar21._0_4_ = fVar150 * auVar94._0_4_;
  auVar21._8_4_ = fVar150 * auVar94._8_4_;
  auVar21._12_4_ = fVar150 * auVar94._12_4_;
  auVar21._16_4_ = fVar150 * auVar94._16_4_;
  auVar21._20_4_ = fVar150 * auVar94._20_4_;
  auVar21._24_4_ = fVar150 * auVar94._24_4_;
  auVar21._28_4_ = auVar94._28_4_;
  auVar18 = vfmadd231ps_fma(auVar21,_local_1a0,auVar78);
  fVar87 = *(float *)(ray + k * 4);
  auVar111._4_4_ = fVar87;
  auVar111._0_4_ = fVar87;
  auVar111._8_4_ = fVar87;
  auVar111._12_4_ = fVar87;
  auVar111._16_4_ = fVar87;
  auVar111._20_4_ = fVar87;
  auVar111._24_4_ = fVar87;
  auVar111._28_4_ = fVar87;
  auVar78 = vsubps_avx(auVar20,auVar111);
  auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),_local_5e0,auVar78);
  local_3c0 = auVar18._0_4_ * auVar64._0_4_;
  fStack_3bc = auVar18._4_4_ * auVar64._4_4_;
  fStack_3b8 = auVar18._8_4_ * auVar64._8_4_;
  fStack_3b4 = auVar18._12_4_ * auVar64._12_4_;
  fStack_3a4 = auVar119._28_4_;
  auVar67._0_4_ = fVar87 + fVar140 * local_3c0;
  auVar67._4_4_ = fVar87 + fVar140 * fStack_3bc;
  auVar67._8_4_ = fVar87 + fVar140 * fStack_3b8;
  auVar67._12_4_ = fVar87 + fVar140 * fStack_3b4;
  auVar67._16_4_ = fVar87 + fVar140 * 0.0;
  auVar67._20_4_ = fVar87 + fVar140 * 0.0;
  auVar67._24_4_ = fVar87 + fVar140 * 0.0;
  auVar67._28_4_ = fVar87 + 0.0;
  auVar142._0_4_ = fVar79 + fVar147 * local_3c0;
  auVar142._4_4_ = fVar79 + fVar147 * fStack_3bc;
  auVar142._8_4_ = fVar79 + fVar147 * fStack_3b8;
  auVar142._12_4_ = fVar79 + fVar147 * fStack_3b4;
  auVar142._16_4_ = fVar79 + fVar147 * 0.0;
  auVar142._20_4_ = fVar79 + fVar147 * 0.0;
  auVar142._24_4_ = fVar79 + fVar147 * 0.0;
  auVar142._28_4_ = fVar79 + auVar78._28_4_;
  uStack_3b0 = 0;
  uStack_3ac = 0;
  uStack_3a8 = 0;
  auVar106._0_4_ = fVar86 + fVar150 * local_3c0;
  auVar106._4_4_ = fVar86 + fVar150 * fStack_3bc;
  auVar106._8_4_ = fVar86 + fVar150 * fStack_3b8;
  auVar106._12_4_ = fVar86 + fVar150 * fStack_3b4;
  auVar106._16_4_ = fVar86 + fVar150 * 0.0;
  auVar106._20_4_ = fVar86 + fVar150 * 0.0;
  auVar106._24_4_ = fVar86 + fVar150 * 0.0;
  auVar106._28_4_ = fVar86 + auVar78._28_4_;
  local_360 = vsubps_avx(auVar75,auVar74);
  _local_540 = vsubps_avx(auVar67,auVar74);
  local_380 = vsubps_avx(auVar82,auVar14);
  _local_560 = vsubps_avx(auVar142,auVar14);
  local_3a0 = vsubps_avx(auVar93,auVar104);
  _local_340 = vsubps_avx(auVar106,auVar104);
  fVar116 = local_3a0._0_4_;
  fVar136 = local_3a0._4_4_;
  auVar14._4_4_ = fVar136 * fVar136;
  auVar14._0_4_ = fVar116 * fVar116;
  fVar137 = local_3a0._8_4_;
  auVar14._8_4_ = fVar137 * fVar137;
  fVar138 = local_3a0._12_4_;
  auVar14._12_4_ = fVar138 * fVar138;
  fVar149 = local_3a0._16_4_;
  auVar14._16_4_ = fVar149 * fVar149;
  fVar152 = local_3a0._20_4_;
  auVar14._20_4_ = fVar152 * fVar152;
  fVar153 = local_3a0._24_4_;
  auVar14._24_4_ = fVar153 * fVar153;
  auVar14._28_4_ = auVar74._28_4_;
  auVar64 = vfmadd231ps_fma(auVar14,local_380,local_380);
  auVar64 = vfmadd231ps_fma(ZEXT1632(auVar64),local_360,local_360);
  fVar160 = local_340._0_4_;
  fVar163 = local_340._4_4_;
  auVar74._4_4_ = fVar163 * fVar136;
  auVar74._0_4_ = fVar160 * fVar116;
  fVar164 = local_340._8_4_;
  auVar74._8_4_ = fVar164 * fVar137;
  fVar165 = local_340._12_4_;
  auVar74._12_4_ = fVar165 * fVar138;
  fVar166 = local_340._16_4_;
  auVar74._16_4_ = fVar166 * fVar149;
  fVar167 = local_340._20_4_;
  auVar74._20_4_ = fVar167 * fVar152;
  fVar168 = local_340._24_4_;
  auVar74._24_4_ = fVar168 * fVar153;
  auVar74._28_4_ = fVar86;
  auVar18 = vfmadd231ps_fma(auVar74,_local_560,local_380);
  auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),_local_540,local_360);
  auVar104._4_4_ = fVar150 * fVar136;
  auVar104._0_4_ = fVar150 * fVar116;
  auVar104._8_4_ = fVar150 * fVar137;
  auVar104._12_4_ = fVar150 * fVar138;
  auVar104._16_4_ = fVar150 * fVar149;
  auVar104._20_4_ = fVar150 * fVar152;
  auVar104._24_4_ = fVar150 * fVar153;
  auVar104._28_4_ = auVar142._28_4_;
  auVar80 = vfmadd231ps_fma(auVar104,_local_1a0,local_380);
  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),_local_5e0,local_360);
  auVar78 = vsubps_avx(auVar15,auVar73);
  fVar89 = auVar78._0_4_;
  fVar91 = auVar78._4_4_;
  fVar158 = auVar78._8_4_;
  fVar159 = auVar78._12_4_;
  fVar169 = auVar78._16_4_;
  fVar172 = auVar78._20_4_;
  fVar173 = auVar78._24_4_;
  fVar156 = local_360._28_4_;
  fVar79 = auVar64._0_4_;
  local_2a0 = fVar89 * fVar89 + fVar79;
  fVar86 = auVar64._4_4_;
  fStack_29c = fVar91 * fVar91 + fVar86;
  fVar87 = auVar64._8_4_;
  fStack_298 = fVar158 * fVar158 + fVar87;
  fVar88 = auVar64._12_4_;
  fStack_294 = fVar159 * fVar159 + fVar88;
  fStack_290 = fVar169 * fVar169 + 0.0;
  fStack_28c = fVar172 * fVar172 + 0.0;
  fStack_288 = fVar173 * fVar173 + 0.0;
  fStack_284 = fVar156 + 0.0;
  auVar22._4_4_ = fVar150 * fVar163;
  auVar22._0_4_ = fVar150 * fVar160;
  auVar22._8_4_ = fVar150 * fVar164;
  auVar22._12_4_ = fVar150 * fVar165;
  auVar22._16_4_ = fVar150 * fVar166;
  auVar22._20_4_ = fVar150 * fVar167;
  auVar22._24_4_ = fVar150 * fVar168;
  auVar22._28_4_ = fVar156;
  auVar19 = vfmadd231ps_fma(auVar22,_local_1a0,_local_560);
  auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),_local_5e0,_local_540);
  fVar177 = fVar79 * fVar79;
  fVar179 = fVar86 * fVar86;
  fVar180 = fVar87 * fVar87;
  fVar181 = fVar88 * fVar88;
  uStack_1a4 = fVar147;
  _local_1c0 = ZEXT1628(CONCAT412(fVar181,CONCAT48(fVar180,CONCAT44(fVar179,fVar177))));
  fVar90 = auVar18._0_4_;
  fVar139 = auVar80._0_4_;
  fVar96 = auVar18._4_4_;
  fVar146 = auVar80._4_4_;
  fVar98 = auVar18._8_4_;
  fVar148 = auVar80._8_4_;
  fVar100 = auVar18._12_4_;
  fVar151 = auVar80._12_4_;
  auVar23._4_4_ = fStack_29c * fVar146 * fVar96;
  auVar23._0_4_ = local_2a0 * fVar139 * fVar90;
  auVar23._8_4_ = fStack_298 * fVar148 * fVar98;
  auVar23._12_4_ = fStack_294 * fVar151 * fVar100;
  auVar23._16_4_ = fStack_290 * 0.0;
  auVar23._20_4_ = fStack_28c * 0.0;
  auVar23._24_4_ = fStack_288 * 0.0;
  auVar23._28_4_ = auVar93._28_4_;
  auVar94 = vsubps_avx(ZEXT1632(CONCAT412(fVar181 * auVar19._12_4_,
                                          CONCAT48(fVar180 * auVar19._8_4_,
                                                   CONCAT44(fVar179 * auVar19._4_4_,
                                                            fVar177 * auVar19._0_4_)))),auVar23);
  auVar104 = ZEXT1632(auVar64);
  fVar118 = auVar15._0_4_;
  fVar92 = fVar118 * fVar79;
  fVar126 = auVar15._4_4_;
  fVar95 = fVar126 * fVar86;
  auVar24._4_4_ = fVar95;
  auVar24._0_4_ = fVar92;
  fVar128 = auVar15._8_4_;
  fVar97 = fVar128 * fVar87;
  auVar24._8_4_ = fVar97;
  fVar130 = auVar15._12_4_;
  fVar99 = fVar130 * fVar88;
  auVar24._12_4_ = fVar99;
  fVar131 = auVar15._16_4_;
  fVar101 = fVar131 * 0.0;
  auVar24._16_4_ = fVar101;
  fVar132 = auVar15._20_4_;
  fVar102 = fVar132 * 0.0;
  auVar24._20_4_ = fVar102;
  fVar133 = auVar15._24_4_;
  fVar174 = auVar15._28_4_;
  fVar103 = fVar133 * 0.0;
  auVar24._24_4_ = fVar103;
  auVar24._28_4_ = fVar174;
  auVar83._0_4_ = fVar92 * fVar89 * fVar139 + auVar94._0_4_;
  auVar83._4_4_ = fVar95 * fVar91 * fVar146 + auVar94._4_4_;
  auVar83._8_4_ = fVar97 * fVar158 * fVar148 + auVar94._8_4_;
  auVar83._12_4_ = fVar99 * fVar159 * fVar151 + auVar94._12_4_;
  auVar83._16_4_ = fVar101 * fVar169 * 0.0 + auVar94._16_4_;
  auVar83._20_4_ = fVar102 * fVar172 * 0.0 + auVar94._20_4_;
  auVar83._24_4_ = fVar103 * fVar173 * 0.0 + auVar94._24_4_;
  auVar83._28_4_ = auVar93._28_4_ + auVar94._28_4_;
  auVar15._4_4_ = fVar163 * fVar163;
  auVar15._0_4_ = fVar160 * fVar160;
  auVar15._8_4_ = fVar164 * fVar164;
  auVar15._12_4_ = fVar165 * fVar165;
  auVar15._16_4_ = fVar166 * fVar166;
  auVar15._20_4_ = fVar167 * fVar167;
  auVar15._24_4_ = fVar168 * fVar168;
  auVar15._28_4_ = auVar94._28_4_;
  auVar64 = vfmadd231ps_fma(auVar15,_local_560,_local_560);
  auVar64 = vfmadd231ps_fma(ZEXT1632(auVar64),_local_540,_local_540);
  auVar25._4_4_ = fStack_29c * fVar96 * fVar96;
  auVar25._0_4_ = local_2a0 * fVar90 * fVar90;
  auVar25._8_4_ = fStack_298 * fVar98 * fVar98;
  auVar25._12_4_ = fStack_294 * fVar100 * fVar100;
  auVar25._16_4_ = fStack_290 * 0.0;
  auVar25._20_4_ = fStack_28c * 0.0;
  auVar25._24_4_ = fStack_288 * 0.0;
  auVar25._28_4_ = local_380._28_4_;
  auVar94 = vsubps_avx(ZEXT1632(CONCAT412(fVar181 * auVar64._12_4_,
                                          CONCAT48(fVar180 * auVar64._8_4_,
                                                   CONCAT44(fVar179 * auVar64._4_4_,
                                                            fVar177 * auVar64._0_4_)))),auVar25);
  auVar26._4_4_ = fVar96 * (fVar91 + fVar91);
  auVar26._0_4_ = fVar90 * (fVar89 + fVar89);
  auVar26._8_4_ = fVar98 * (fVar158 + fVar158);
  auVar26._12_4_ = fVar100 * (fVar159 + fVar159);
  auVar26._16_4_ = (fVar169 + fVar169) * 0.0;
  auVar26._20_4_ = (fVar172 + fVar172) * 0.0;
  auVar26._24_4_ = (fVar173 + fVar173) * 0.0;
  auVar26._28_4_ = auVar78._28_4_ + auVar78._28_4_;
  auVar78 = vsubps_avx(auVar26,auVar24);
  fVar117 = fVar139 * fVar139;
  fVar125 = fVar146 * fVar146;
  fVar127 = fVar148 * fVar148;
  fVar129 = fVar151 * fVar151;
  auVar27._4_4_ = fStack_29c * fVar125;
  auVar27._0_4_ = local_2a0 * fVar117;
  auVar27._8_4_ = fStack_298 * fVar127;
  auVar27._12_4_ = fStack_294 * fVar129;
  auVar27._16_4_ = fStack_290 * 0.0;
  auVar27._20_4_ = fStack_28c * 0.0;
  auVar27._24_4_ = fStack_288 * 0.0;
  auVar27._28_4_ = fVar174;
  auVar14 = vsubps_avx(_local_1c0,auVar27);
  auVar28._4_4_ = auVar14._4_4_ * (auVar94._4_4_ + fVar95 * auVar78._4_4_);
  auVar28._0_4_ = auVar14._0_4_ * (auVar94._0_4_ + fVar92 * auVar78._0_4_);
  auVar28._8_4_ = auVar14._8_4_ * (auVar94._8_4_ + fVar97 * auVar78._8_4_);
  auVar28._12_4_ = auVar14._12_4_ * (auVar94._12_4_ + fVar99 * auVar78._12_4_);
  auVar28._16_4_ = auVar14._16_4_ * (auVar94._16_4_ + fVar101 * auVar78._16_4_);
  auVar28._20_4_ = auVar14._20_4_ * (auVar94._20_4_ + fVar102 * auVar78._20_4_);
  auVar28._24_4_ = auVar14._24_4_ * (auVar94._24_4_ + fVar103 * auVar78._24_4_);
  auVar28._28_4_ = auVar94._28_4_ + fVar174;
  auVar29._4_4_ = auVar83._4_4_ * auVar83._4_4_;
  auVar29._0_4_ = auVar83._0_4_ * auVar83._0_4_;
  auVar29._8_4_ = auVar83._8_4_ * auVar83._8_4_;
  auVar29._12_4_ = auVar83._12_4_ * auVar83._12_4_;
  auVar29._16_4_ = auVar83._16_4_ * auVar83._16_4_;
  auVar29._20_4_ = auVar83._20_4_ * auVar83._20_4_;
  auVar29._24_4_ = auVar83._24_4_ * auVar83._24_4_;
  auVar29._28_4_ = fVar174;
  auVar94 = vsubps_avx(auVar29,auVar28);
  auVar74 = ZEXT1232(ZEXT412(0)) << 0x20;
  auVar78 = vcmpps_avx(auVar94,auVar74,5);
  auVar15 = auVar78 & ~auVar65;
  if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0x7f,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar15 >> 0xbf,0) != '\0') ||
      (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0') {
    auVar78 = vandnps_avx(auVar65,auVar78);
    auVar64 = vpackssdw_avx(auVar78._0_16_,auVar78._16_16_);
    auVar65 = vsubps_avx(auVar67,auVar75);
    auVar82 = vsubps_avx(auVar142,auVar82);
    auVar93 = vsubps_avx(auVar106,auVar93);
    auVar120._2_2_ = 0;
    auVar120._0_2_ = uVar3;
    auVar120._4_2_ = uVar3;
    auVar120._6_2_ = 0;
    auVar120._8_2_ = uVar3;
    auVar120._10_2_ = 0;
    auVar120._12_2_ = uVar3;
    auVar120._14_2_ = 0;
    auVar120._16_2_ = uVar3;
    auVar120._18_2_ = 0;
    auVar120._20_2_ = uVar3;
    auVar120._22_2_ = 0;
    auVar120._24_2_ = uVar3;
    auVar120._26_2_ = 0;
    auVar120._28_2_ = uVar3;
    auVar120._30_2_ = 0;
    auVar15 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar78 = vpand_avx2(auVar15,auVar120);
    auVar78 = vpcmpeqd_avx2(auVar78,auVar74);
    auVar18 = vpackssdw_avx(auVar78._0_16_,auVar78._16_16_);
    auVar121._2_2_ = 0;
    auVar121._0_2_ = uVar2;
    auVar121._4_2_ = uVar2;
    auVar121._6_2_ = 0;
    auVar121._8_2_ = uVar2;
    auVar121._10_2_ = 0;
    auVar121._12_2_ = uVar2;
    auVar121._14_2_ = 0;
    auVar121._16_2_ = uVar2;
    auVar121._18_2_ = 0;
    auVar121._20_2_ = uVar2;
    auVar121._22_2_ = 0;
    auVar121._24_2_ = uVar2;
    auVar121._26_2_ = 0;
    auVar121._28_2_ = uVar2;
    auVar121._30_2_ = 0;
    auVar94 = vsqrtps_avx(auVar94);
    auVar74 = vpand_avx2(auVar15,auVar121);
    auVar78 = vrcpps_avx(auVar14);
    auVar68._8_4_ = 0x3f800000;
    auVar68._0_8_ = &DAT_3f8000003f800000;
    auVar68._12_4_ = 0x3f800000;
    auVar68._16_4_ = 0x3f800000;
    auVar68._20_4_ = 0x3f800000;
    auVar68._24_4_ = 0x3f800000;
    auVar68._28_4_ = 0x3f800000;
    auVar19 = vfnmadd213ps_fma(auVar78,auVar14,auVar68);
    auVar69._8_4_ = 0x7fffffff;
    auVar69._0_8_ = 0x7fffffff7fffffff;
    auVar69._12_4_ = 0x7fffffff;
    auVar69._16_4_ = 0x7fffffff;
    auVar69._20_4_ = 0x7fffffff;
    auVar69._24_4_ = 0x7fffffff;
    auVar69._28_4_ = 0x7fffffff;
    auVar19 = vfmadd132ps_fma(ZEXT1632(auVar19),auVar78,auVar78);
    auVar78 = vandps_avx(auVar14,auVar69);
    auVar112._8_4_ = 0x219392ef;
    auVar112._0_8_ = 0x219392ef219392ef;
    auVar112._12_4_ = 0x219392ef;
    auVar112._16_4_ = 0x219392ef;
    auVar112._20_4_ = 0x219392ef;
    auVar112._24_4_ = 0x219392ef;
    auVar112._28_4_ = 0x219392ef;
    auVar78 = vcmpps_avx(auVar78,auVar112,2);
    uVar59 = CONCAT44(auVar83._4_4_,auVar83._0_4_);
    auVar113._0_8_ = uVar59 ^ 0x8000000080000000;
    auVar113._8_4_ = -auVar83._8_4_;
    auVar113._12_4_ = -auVar83._12_4_;
    auVar113._16_4_ = -auVar83._16_4_;
    auVar113._20_4_ = -auVar83._20_4_;
    auVar113._24_4_ = -auVar83._24_4_;
    auVar113._28_4_ = -auVar83._28_4_;
    auVar14 = vsubps_avx(auVar113,auVar94);
    auVar15 = vsubps_avx(auVar94,auVar83);
    auVar30._4_4_ = auVar19._4_4_ * auVar14._4_4_;
    auVar30._0_4_ = auVar19._0_4_ * auVar14._0_4_;
    auVar30._8_4_ = auVar19._8_4_ * auVar14._8_4_;
    auVar30._12_4_ = auVar19._12_4_ * auVar14._12_4_;
    auVar30._16_4_ = auVar14._16_4_ * 0.0;
    auVar30._20_4_ = auVar14._20_4_ * 0.0;
    auVar30._24_4_ = auVar14._24_4_ * 0.0;
    auVar30._28_4_ = auVar94._28_4_;
    auVar161._0_4_ = auVar19._0_4_ * auVar15._0_4_;
    auVar161._4_4_ = auVar19._4_4_ * auVar15._4_4_;
    auVar161._8_4_ = auVar19._8_4_ * auVar15._8_4_;
    auVar161._12_4_ = auVar19._12_4_ * auVar15._12_4_;
    auVar161._16_4_ = auVar15._16_4_ * 0.0;
    auVar161._20_4_ = auVar15._20_4_ * 0.0;
    auVar161._24_4_ = auVar15._24_4_ * 0.0;
    auVar161._28_4_ = 0;
    auVar107._8_4_ = 0xff800000;
    auVar107._0_8_ = 0xff800000ff800000;
    auVar107._12_4_ = 0xff800000;
    auVar107._16_4_ = 0xff800000;
    auVar107._20_4_ = 0xff800000;
    auVar107._24_4_ = 0xff800000;
    auVar107._28_4_ = 0xff800000;
    auVar94 = vblendvps_avx(auVar30,auVar107,auVar78);
    auVar84._8_4_ = 0x7f800000;
    auVar84._0_8_ = 0x7f8000007f800000;
    auVar84._12_4_ = 0x7f800000;
    auVar84._16_4_ = 0x7f800000;
    auVar84._20_4_ = 0x7f800000;
    auVar84._24_4_ = 0x7f800000;
    auVar84._28_4_ = 0x7f800000;
    auVar14 = vblendvps_avx(auVar161,auVar84,auVar78);
    auVar114._0_4_ = fVar90 + fVar139 * auVar94._0_4_;
    auVar114._4_4_ = fVar96 + fVar146 * auVar94._4_4_;
    auVar114._8_4_ = fVar98 + fVar148 * auVar94._8_4_;
    auVar114._12_4_ = fVar100 + fVar151 * auVar94._12_4_;
    auVar114._16_4_ = auVar94._16_4_ * 0.0 + 0.0;
    auVar114._20_4_ = auVar94._20_4_ * 0.0 + 0.0;
    auVar114._24_4_ = auVar94._24_4_ * 0.0 + 0.0;
    auVar114._28_4_ = 0;
    auVar75 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar78 = vcmpps_avx(auVar114,auVar75,6);
    auVar15 = vcmpps_avx(auVar114,auVar104,1);
    auVar78 = vandps_avx(auVar15,auVar78);
    auVar19 = vpackssdw_avx(auVar78._0_16_,auVar78._16_16_);
    auVar19 = vpand_avx(auVar19,auVar64);
    auVar78 = vpmovsxwd_avx2(auVar19);
    local_2e0 = vblendvps_avx(auVar84,auVar94,auVar78);
    auVar15 = vpcmpeqd_avx2(auVar74,auVar75);
    local_400._0_4_ = fVar90 + fVar139 * auVar14._0_4_;
    local_400._4_4_ = fVar96 + fVar146 * auVar14._4_4_;
    local_400._8_4_ = fVar98 + fVar148 * auVar14._8_4_;
    local_400._12_4_ = fVar100 + fVar151 * auVar14._12_4_;
    local_400._16_4_ = auVar14._16_4_ * 0.0 + 0.0;
    local_400._20_4_ = auVar14._20_4_ * 0.0 + 0.0;
    local_400._24_4_ = auVar14._24_4_ * 0.0 + 0.0;
    local_400._28_4_ = auVar78._28_4_ + 0.0;
    auVar78 = vcmpps_avx(local_400,auVar75,6);
    auVar94 = vcmpps_avx(local_400,auVar104,1);
    auVar78 = vandps_avx(auVar94,auVar78);
    auVar19 = vpackssdw_avx(auVar78._0_16_,auVar78._16_16_);
    auVar19 = vpand_avx(auVar64,auVar19);
    auVar78 = vpmovsxwd_avx2(auVar19);
    local_3e0 = vblendvps_avx(auVar107,auVar14,auVar78);
    auVar19 = vpackssdw_avx(auVar15._0_16_,auVar15._16_16_);
    auVar78 = vrcpps_avx(ZEXT1632(auVar80));
    auVar85._8_4_ = 0x3f800000;
    auVar85._0_8_ = &DAT_3f8000003f800000;
    auVar85._12_4_ = 0x3f800000;
    auVar85._16_4_ = 0x3f800000;
    auVar85._20_4_ = 0x3f800000;
    auVar85._24_4_ = 0x3f800000;
    auVar85._28_4_ = 0x3f800000;
    auVar80 = vfnmadd213ps_fma(auVar78,ZEXT1632(auVar80),auVar85);
    auVar17 = vfmadd132ps_fma(ZEXT1632(auVar80),auVar78,auVar78);
    auVar31._4_4_ = fVar146 * (float)local_540._4_4_;
    auVar31._0_4_ = fVar139 * (float)local_540._0_4_;
    auVar31._8_4_ = fVar148 * fStack_538;
    auVar31._12_4_ = fVar151 * fStack_534;
    auVar31._16_4_ = fStack_530 * 0.0;
    auVar31._20_4_ = fStack_52c * 0.0;
    auVar31._24_4_ = fStack_528 * 0.0;
    auVar31._28_4_ = auVar78._28_4_;
    auVar157._0_4_ = fVar90 * fVar140;
    auVar157._4_4_ = fVar96 * fVar140;
    auVar157._8_4_ = fVar98 * fVar140;
    auVar157._12_4_ = fVar100 * fVar140;
    auVar157._16_4_ = fVar140 * 0.0;
    auVar157._20_4_ = fVar140 * 0.0;
    auVar157._24_4_ = fVar140 * 0.0;
    auVar157._28_4_ = 0;
    auVar78 = vsubps_avx(auVar31,auVar157);
    auVar32._4_4_ = fVar146 * (float)local_560._4_4_;
    auVar32._0_4_ = fVar139 * (float)local_560._0_4_;
    auVar32._8_4_ = fVar148 * fStack_558;
    auVar32._12_4_ = fVar151 * fStack_554;
    auVar32._16_4_ = fStack_550 * 0.0;
    auVar32._20_4_ = fStack_54c * 0.0;
    auVar32._24_4_ = fStack_548 * 0.0;
    auVar32._28_4_ = 0;
    auVar33._4_4_ = fVar147 * fVar96;
    auVar33._0_4_ = fVar147 * fVar90;
    auVar33._8_4_ = fVar147 * fVar98;
    auVar33._12_4_ = fVar147 * fVar100;
    auVar33._16_4_ = fVar147 * 0.0;
    auVar33._20_4_ = fVar147 * 0.0;
    auVar33._24_4_ = fVar147 * 0.0;
    auVar33._28_4_ = auVar74._28_4_;
    auVar94 = vsubps_avx(auVar32,auVar33);
    auVar34._4_4_ = fVar146 * fVar163;
    auVar34._0_4_ = fVar139 * fVar160;
    auVar34._8_4_ = fVar148 * fVar164;
    auVar34._12_4_ = fVar151 * fVar165;
    auVar34._16_4_ = fVar166 * 0.0;
    auVar34._20_4_ = fVar167 * 0.0;
    auVar34._24_4_ = fVar168 * 0.0;
    auVar34._28_4_ = auVar74._28_4_;
    auVar175._0_4_ = fVar90 * fVar150;
    auVar175._4_4_ = fVar96 * fVar150;
    auVar175._8_4_ = fVar98 * fVar150;
    auVar175._12_4_ = fVar100 * fVar150;
    auVar175._16_4_ = fVar150 * 0.0;
    auVar175._20_4_ = fVar150 * 0.0;
    auVar175._24_4_ = fVar150 * 0.0;
    auVar175._28_4_ = 0;
    auVar14 = vsubps_avx(auVar34,auVar175);
    auVar35._4_4_ = auVar14._4_4_ * auVar14._4_4_;
    auVar35._0_4_ = auVar14._0_4_ * auVar14._0_4_;
    auVar35._8_4_ = auVar14._8_4_ * auVar14._8_4_;
    auVar35._12_4_ = auVar14._12_4_ * auVar14._12_4_;
    auVar35._16_4_ = auVar14._16_4_ * auVar14._16_4_;
    auVar35._20_4_ = auVar14._20_4_ * auVar14._20_4_;
    auVar35._24_4_ = auVar14._24_4_ * auVar14._24_4_;
    auVar35._28_4_ = auVar14._28_4_;
    auVar80 = vfmadd231ps_fma(auVar35,auVar94,auVar94);
    auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar78,auVar78);
    auVar36._4_4_ = fVar125 * fVar126 * fVar126;
    auVar36._0_4_ = fVar117 * fVar118 * fVar118;
    auVar36._8_4_ = fVar127 * fVar128 * fVar128;
    auVar36._12_4_ = fVar129 * fVar130 * fVar130;
    auVar36._16_4_ = fVar131 * fVar131 * 0.0;
    auVar36._20_4_ = fVar132 * fVar132 * 0.0;
    auVar36._24_4_ = fVar133 * fVar133 * 0.0;
    auVar36._28_4_ = fVar174;
    auVar78 = vcmpps_avx(ZEXT1632(auVar80),auVar36,1);
    auVar80 = vpackssdw_avx(auVar78._0_16_,auVar78._16_16_);
    auVar80 = vpand_avx(auVar19,auVar80);
    auVar37._4_4_ = auVar17._4_4_ * -fVar96;
    auVar37._0_4_ = auVar17._0_4_ * -fVar90;
    auVar37._8_4_ = auVar17._8_4_ * -fVar98;
    auVar37._12_4_ = auVar17._12_4_ * -fVar100;
    auVar37._16_4_ = 0x80000000;
    auVar37._20_4_ = 0x80000000;
    auVar37._24_4_ = 0x80000000;
    auVar37._28_4_ = 0x80000000;
    auVar80 = vpand_avx(auVar64,auVar80);
    auVar78 = vpmovsxwd_avx2(auVar80);
    auVar170._8_4_ = 0x7f800000;
    auVar170._0_8_ = 0x7f8000007f800000;
    auVar170._12_4_ = 0x7f800000;
    auVar170._16_4_ = 0x7f800000;
    auVar170._20_4_ = 0x7f800000;
    auVar170._24_4_ = 0x7f800000;
    auVar170._28_4_ = 0x7f800000;
    local_300 = vblendvps_avx(auVar170,auVar37,auVar78);
    local_2c0._0_4_ = auVar93._0_4_;
    local_2c0._4_4_ = auVar93._4_4_;
    fStack_2b8 = auVar93._8_4_;
    fStack_2b4 = auVar93._12_4_;
    auStack_2b0._0_4_ = auVar93._16_4_;
    auStack_2b0._4_4_ = auVar93._20_4_;
    fStack_2a8 = auVar93._24_4_;
    uStack_2a4 = auVar93._28_4_;
    auVar38._4_4_ = (float)local_2c0._4_4_ * fVar136;
    auVar38._0_4_ = (float)local_2c0._0_4_ * fVar116;
    auVar38._8_4_ = fStack_2b8 * fVar137;
    auVar38._12_4_ = fStack_2b4 * fVar138;
    auVar38._16_4_ = (float)auStack_2b0._0_4_ * fVar149;
    auVar38._20_4_ = (float)auStack_2b0._4_4_ * fVar152;
    auVar38._24_4_ = fStack_2a8 * fVar153;
    auVar38._28_4_ = 0x80000000;
    auVar80 = vfmadd231ps_fma(auVar38,auVar82,local_380);
    auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar65,local_360);
    auVar39._4_4_ = fVar146 * auVar65._4_4_;
    auVar39._0_4_ = fVar139 * auVar65._0_4_;
    auVar39._8_4_ = fVar148 * auVar65._8_4_;
    auVar39._12_4_ = fVar151 * auVar65._12_4_;
    auVar39._16_4_ = auVar65._16_4_ * 0.0;
    auVar39._20_4_ = auVar65._20_4_ * 0.0;
    auVar39._24_4_ = auVar65._24_4_ * 0.0;
    auVar39._28_4_ = auVar65._28_4_;
    auVar40._4_4_ = fVar146 * auVar82._4_4_;
    auVar40._0_4_ = fVar139 * auVar82._0_4_;
    auVar40._8_4_ = fVar148 * auVar82._8_4_;
    auVar40._12_4_ = fVar151 * auVar82._12_4_;
    auVar40._16_4_ = auVar82._16_4_ * 0.0;
    auVar40._20_4_ = auVar82._20_4_ * 0.0;
    auVar40._24_4_ = auVar82._24_4_ * 0.0;
    auVar40._28_4_ = auVar82._28_4_;
    auVar41._4_4_ = fVar146 * (float)local_2c0._4_4_;
    auVar41._0_4_ = fVar139 * (float)local_2c0._0_4_;
    auVar41._8_4_ = fVar148 * fStack_2b8;
    auVar41._12_4_ = fVar151 * fStack_2b4;
    auVar41._16_4_ = (float)auStack_2b0._0_4_ * 0.0;
    auVar41._20_4_ = (float)auStack_2b0._4_4_ * 0.0;
    auVar41._24_4_ = fStack_2a8 * 0.0;
    auVar41._28_4_ = uStack_2a4;
    fVar90 = auVar80._0_4_;
    auVar143._0_4_ = fVar90 * fVar140;
    fVar96 = auVar80._4_4_;
    auVar143._4_4_ = fVar96 * fVar140;
    fVar98 = auVar80._8_4_;
    auVar143._8_4_ = fVar98 * fVar140;
    fVar100 = auVar80._12_4_;
    auVar143._12_4_ = fVar100 * fVar140;
    auVar143._16_4_ = fVar140 * 0.0;
    auVar143._20_4_ = fVar140 * 0.0;
    auVar143._24_4_ = fVar140 * 0.0;
    auVar143._28_4_ = 0;
    auVar78 = vsubps_avx(auVar39,auVar143);
    auVar42._4_4_ = fVar147 * fVar96;
    auVar42._0_4_ = fVar147 * fVar90;
    auVar42._8_4_ = fVar147 * fVar98;
    auVar42._12_4_ = fVar147 * fVar100;
    auVar42._16_4_ = fVar147 * 0.0;
    auVar42._20_4_ = fVar147 * 0.0;
    auVar42._24_4_ = fVar147 * 0.0;
    auVar42._28_4_ = 0;
    auVar94 = vsubps_avx(auVar40,auVar42);
    auVar43._4_4_ = fVar150 * fVar96;
    auVar43._0_4_ = fVar150 * fVar90;
    auVar43._8_4_ = fVar150 * fVar98;
    auVar43._12_4_ = fVar150 * fVar100;
    auVar43._16_4_ = fVar150 * 0.0;
    auVar43._20_4_ = fVar150 * 0.0;
    auVar43._24_4_ = fVar150 * 0.0;
    auVar43._28_4_ = auVar82._28_4_;
    auVar14 = vsubps_avx(auVar41,auVar43);
    auVar44._4_4_ = auVar14._4_4_ * auVar14._4_4_;
    auVar44._0_4_ = auVar14._0_4_ * auVar14._0_4_;
    auVar44._8_4_ = auVar14._8_4_ * auVar14._8_4_;
    auVar44._12_4_ = auVar14._12_4_ * auVar14._12_4_;
    auVar44._16_4_ = auVar14._16_4_ * auVar14._16_4_;
    auVar44._20_4_ = auVar14._20_4_ * auVar14._20_4_;
    auVar44._24_4_ = auVar14._24_4_ * auVar14._24_4_;
    auVar44._28_4_ = auVar14._28_4_;
    auVar80 = vfmadd231ps_fma(auVar44,auVar94,auVar94);
    auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar78,auVar78);
    local_500._0_4_ = auVar73._0_4_;
    local_500._4_4_ = auVar73._4_4_;
    fStack_4f8 = auVar73._8_4_;
    fStack_4f4 = auVar73._12_4_;
    fStack_4f0 = auVar73._16_4_;
    fStack_4ec = auVar73._20_4_;
    fStack_4e8 = auVar73._24_4_;
    auVar45._4_4_ = fVar125 * (float)local_500._4_4_ * (float)local_500._4_4_;
    auVar45._0_4_ = fVar117 * (float)local_500._0_4_ * (float)local_500._0_4_;
    auVar45._8_4_ = fVar127 * fStack_4f8 * fStack_4f8;
    auVar45._12_4_ = fVar129 * fStack_4f4 * fStack_4f4;
    auVar45._16_4_ = fStack_4f0 * fStack_4f0 * 0.0;
    auVar45._20_4_ = fStack_4ec * fStack_4ec * 0.0;
    auVar45._24_4_ = fStack_4e8 * fStack_4e8 * 0.0;
    auVar45._28_4_ = auVar94._28_4_;
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
    auVar70._4_4_ = uVar1;
    auVar70._0_4_ = uVar1;
    auVar70._8_4_ = uVar1;
    auVar70._12_4_ = uVar1;
    auVar70._16_4_ = uVar1;
    auVar70._20_4_ = uVar1;
    auVar70._24_4_ = uVar1;
    auVar70._28_4_ = uVar1;
    auVar78 = vcmpps_avx(ZEXT1632(auVar80),auVar45,1);
    auVar80 = vpackssdw_avx(auVar78._0_16_,auVar78._16_16_);
    auVar18 = vpand_avx(auVar80,auVar18);
    auVar76._0_4_ = auVar17._0_4_ * -fVar90;
    auVar76._4_4_ = auVar17._4_4_ * -fVar96;
    auVar76._8_4_ = auVar17._8_4_ * -fVar98;
    auVar76._12_4_ = auVar17._12_4_ * -fVar100;
    auVar76._16_4_ = 0x80000000;
    auVar76._20_4_ = 0x80000000;
    auVar76._24_4_ = 0x80000000;
    auVar76._28_4_ = 0;
    auVar18 = vpand_avx(auVar64,auVar18);
    auVar78 = vpmovsxwd_avx2(auVar18);
    auVar78 = vblendvps_avx(auVar170,auVar76,auVar78);
    auVar15 = vminps_avx(local_300,auVar78);
    auVar94 = vmaxps_avx(local_300,auVar78);
    auVar74 = vminps_avx(local_2e0,auVar15);
    auVar14 = vcmpps_avx(auVar74,auVar15,0);
    auVar78 = vcmpps_avx(auVar170,auVar94,0);
    auVar122._8_4_ = 0xff800000;
    auVar122._0_8_ = 0xff800000ff800000;
    auVar122._12_4_ = 0xff800000;
    auVar122._16_4_ = 0xff800000;
    auVar122._20_4_ = 0xff800000;
    auVar122._24_4_ = 0xff800000;
    auVar122._28_4_ = 0xff800000;
    auVar78 = vblendvps_avx(auVar94,auVar122,auVar78);
    auVar94 = vcmpps_avx(auVar170,auVar15,0);
    auVar94 = vblendvps_avx(auVar15,auVar122,auVar94);
    auVar94 = vblendvps_avx(auVar94,auVar78,auVar14);
    auVar108._0_4_ = local_3c0 + auVar74._0_4_;
    auVar108._4_4_ = fStack_3bc + auVar74._4_4_;
    auVar108._8_4_ = fStack_3b8 + auVar74._8_4_;
    auVar108._12_4_ = fStack_3b4 + auVar74._12_4_;
    auVar108._16_4_ = auVar74._16_4_ + 0.0;
    auVar108._20_4_ = auVar74._20_4_ + 0.0;
    auVar108._24_4_ = auVar74._24_4_ + 0.0;
    auVar108._28_4_ = fStack_3a4 + auVar74._28_4_;
    auVar78 = vcmpps_avx(auVar70,auVar108,2);
    fStack_584 = *(float *)(ray + k * 4 + 0x80);
    auVar155._4_4_ = fStack_584;
    auVar155._0_4_ = fStack_584;
    auVar155._8_4_ = fStack_584;
    auVar155._12_4_ = fStack_584;
    auVar155._16_4_ = fStack_584;
    auVar155._20_4_ = fStack_584;
    auVar155._24_4_ = fStack_584;
    auVar155._28_4_ = fStack_584;
    auVar14 = vcmpps_avx(auVar108,auVar155,2);
    auVar78 = vandps_avx(auVar78,auVar14);
    local_80 = vmaxps_avx(local_3e0,auVar94);
    auVar94 = vcmpps_avx(auVar74,auVar170,4);
    auVar78 = vandps_avx(auVar78,auVar94);
    auVar18 = vpackssdw_avx(auVar78._0_16_,auVar78._16_16_);
    local_4c0 = vpand_avx(auVar64,auVar18);
    local_580._0_4_ = local_3c0 + local_80._0_4_;
    local_580._4_4_ = fStack_3bc + local_80._4_4_;
    local_580._8_4_ = fStack_3b8 + local_80._8_4_;
    local_580._12_4_ = fStack_3b4 + local_80._12_4_;
    local_580._16_4_ = local_80._16_4_ + 0.0;
    local_580._20_4_ = local_80._20_4_ + 0.0;
    local_580._24_4_ = local_80._24_4_ + 0.0;
    local_580._28_4_ = fStack_3a4 + local_80._28_4_;
    auVar78 = vcmpps_avx(auVar70,local_580,2);
    auVar94 = vcmpps_avx(local_580,auVar155,2);
    auVar78 = vandps_avx(auVar78,auVar94);
    auVar94 = vcmpps_avx(local_80,auVar122,4);
    auVar78 = vandps_avx(auVar78,auVar94);
    auVar18 = vpackssdw_avx(auVar78._0_16_,auVar78._16_16_);
    local_4e0 = vpand_avx(auVar18,auVar64);
    _local_2c0 = vpor_avx(local_4c0,local_4e0);
    auVar78 = vpmovsxwd_avx2(_local_2c0);
    if ((((((((auVar78 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar78 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar78 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar78 >> 0x7f,0) != '\0') ||
          (auVar78 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar78 >> 0xbf,0) != '\0') ||
        (auVar78 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar78[0x1f] < '\0')
    {
      auStack_4d0 = auVar82._16_16_;
      auStack_4b0 = auVar65._16_16_;
      auVar78 = vpmovzxwd_avx2(local_4c0);
      auVar94 = vpslld_avx2(auVar78,0x1f);
      auVar78 = vblendvps_avx(local_80,auVar74,auVar94);
      auVar74 = vrcpps_avx(auVar104);
      auVar94 = vblendvps_avx(local_400,auVar114,auVar94);
      _auStack_2b0 = auVar93._16_16_;
      auVar176._8_4_ = 0x3f800000;
      auVar176._0_8_ = &DAT_3f8000003f800000;
      auVar176._12_4_ = 0x3f800000;
      auVar176._16_4_ = 0x3f800000;
      auVar176._20_4_ = 0x3f800000;
      auVar176._24_4_ = 0x3f800000;
      auVar176._28_4_ = 0x3f800000;
      auVar19 = vfnmadd213ps_fma(auVar74,auVar104,auVar176);
      fVar118 = fVar79 * fVar89 * fVar118;
      fVar126 = fVar86 * fVar91 * fVar126;
      fVar128 = fVar87 * fVar158 * fVar128;
      fVar130 = fVar88 * fVar159 * fVar130;
      fVar131 = fVar169 * 0.0 * fVar131;
      fVar132 = fVar172 * 0.0 * fVar132;
      fVar133 = fVar173 * 0.0 * fVar133;
      local_5a0 = local_360._0_4_ * fVar118;
      fStack_59c = local_360._4_4_ * fVar126;
      fVar99 = local_360._8_4_;
      fVar101 = local_360._12_4_;
      fVar102 = local_360._16_4_;
      fVar103 = local_360._20_4_;
      fVar117 = local_360._24_4_;
      local_a0 = local_360._0_4_ * local_2a0;
      fStack_9c = local_360._4_4_ * fStack_29c;
      fStack_84 = auVar74._28_4_;
      auVar14 = vcmpps_avx(auVar78,local_2e0,0);
      auVar15 = vcmpps_avx(local_3e0,auVar78,0);
      auVar14 = vorps_avx(auVar14,auVar15);
      auVar18 = vpackssdw_avx(auVar14._0_16_,auVar14._16_16_);
      auVar80 = vpand_avx(auVar18,auVar64);
      auVar14 = vcmpps_avx(local_300,auVar78,0);
      auVar18 = vpackssdw_avx(auVar14._0_16_,auVar14._16_16_);
      auVar64 = vpand_avx(auVar18,auVar64);
      fVar79 = auVar78._0_4_;
      fVar86 = auVar78._4_4_;
      fVar87 = auVar78._8_4_;
      fVar88 = auVar78._12_4_;
      fVar89 = auVar78._16_4_;
      fVar90 = auVar78._20_4_;
      fVar91 = auVar78._24_4_;
      fStack_598 = fVar99 * fVar128;
      fStack_594 = fVar101 * fVar130;
      fStack_590 = fVar102 * fVar131;
      fStack_58c = fVar103 * fVar132;
      fStack_588 = fVar117 * fVar133;
      auVar135._0_4_ = local_5a0 + fVar177 * (fVar79 * fVar140 + (float)local_540._0_4_);
      auVar135._4_4_ = fStack_59c + fVar179 * (fVar86 * fVar140 + (float)local_540._4_4_);
      auVar135._8_4_ = fVar99 * fVar128 + fVar180 * (fVar87 * fVar140 + fStack_538);
      auVar135._12_4_ = fVar101 * fVar130 + fVar181 * (fVar88 * fVar140 + fStack_534);
      auVar135._16_4_ = fVar102 * fVar131 + (fVar89 * fVar140 + fStack_530) * 0.0;
      auVar135._20_4_ = fVar103 * fVar132 + (fVar90 * fVar140 + fStack_52c) * 0.0;
      auVar135._24_4_ = fVar117 * fVar133 + (fVar91 * fVar140 + fStack_528) * 0.0;
      auVar135._28_4_ = fStack_584 + local_300._28_4_ + fStack_524;
      fStack_98 = fVar99 * fStack_298;
      fStack_94 = fVar101 * fStack_294;
      fStack_90 = fVar102 * fStack_290;
      fStack_8c = fVar103 * fStack_28c;
      fStack_88 = fVar117 * fStack_288;
      fVar169 = auVar94._0_4_;
      auVar144._0_4_ = fVar169 * local_a0;
      fVar172 = auVar94._4_4_;
      auVar144._4_4_ = fVar172 * fStack_9c;
      fVar173 = auVar94._8_4_;
      auVar144._8_4_ = fVar173 * fVar99 * fStack_298;
      fVar174 = auVar94._12_4_;
      auVar144._12_4_ = fVar174 * fVar101 * fStack_294;
      fVar92 = auVar94._16_4_;
      auVar144._16_4_ = fVar92 * fVar102 * fStack_290;
      fVar95 = auVar94._20_4_;
      auVar144._20_4_ = fVar95 * fVar103 * fStack_28c;
      fVar97 = auVar94._24_4_;
      auVar144._24_4_ = fVar97 * fVar117 * fStack_288;
      auVar144._28_4_ = 0;
      auVar14 = vsubps_avx(auVar135,auVar144);
      local_e0 = local_380._0_4_ * fVar118;
      fStack_dc = local_380._4_4_ * fVar126;
      fVar96 = local_380._8_4_;
      fVar158 = local_380._12_4_;
      fVar98 = local_380._16_4_;
      fVar159 = local_380._20_4_;
      fVar100 = local_380._24_4_;
      fStack_d8 = fVar96 * fVar128;
      fStack_d4 = fVar158 * fVar130;
      fStack_d0 = fVar98 * fVar131;
      fStack_cc = fVar159 * fVar132;
      fStack_c8 = fVar100 * fVar133;
      fStack_c4 = fStack_84;
      auVar145._0_4_ = fVar177 * (fVar147 * fVar79 + (float)local_560._0_4_) + local_e0;
      auVar145._4_4_ = fVar179 * (fVar147 * fVar86 + (float)local_560._4_4_) + fStack_dc;
      auVar145._8_4_ = fVar180 * (fVar147 * fVar87 + fStack_558) + fVar96 * fVar128;
      auVar145._12_4_ = fVar181 * (fVar147 * fVar88 + fStack_554) + fVar158 * fVar130;
      auVar145._16_4_ = (fVar147 * fVar89 + fStack_550) * 0.0 + fVar98 * fVar131;
      auVar145._20_4_ = (fVar147 * fVar90 + fStack_54c) * 0.0 + fVar159 * fVar132;
      auVar145._24_4_ = (fVar147 * fVar91 + fStack_548) * 0.0 + fVar100 * fVar133;
      auVar145._28_4_ = fStack_544 + 0.0 + fStack_84;
      local_c0 = local_380._0_4_ * local_2a0;
      fStack_bc = local_380._4_4_ * fStack_29c;
      fStack_b8 = fVar96 * fStack_298;
      fStack_b4 = fVar158 * fStack_294;
      fStack_b0 = fVar98 * fStack_290;
      fStack_ac = fVar159 * fStack_28c;
      fStack_a8 = fVar100 * fStack_288;
      fStack_a4 = fStack_84;
      auVar46._4_4_ = fVar172 * fStack_bc;
      auVar46._0_4_ = fVar169 * local_c0;
      auVar46._8_4_ = fVar173 * fVar96 * fStack_298;
      auVar46._12_4_ = fVar174 * fVar158 * fStack_294;
      auVar46._16_4_ = fVar92 * fVar98 * fStack_290;
      auVar46._20_4_ = fVar95 * fVar159 * fStack_28c;
      auVar46._24_4_ = fVar97 * fVar100 * fStack_288;
      auVar46._28_4_ = fStack_584;
      auVar15 = vsubps_avx(auVar145,auVar46);
      auVar104 = vpmovsxwd_avx2(auVar64);
      local_120._0_8_ = local_360._0_8_ ^ 0x8000000080000000;
      local_120._8_4_ = -fVar99;
      local_120._12_4_ = -fVar101;
      local_120._16_4_ = -fVar102;
      local_120._20_4_ = -fVar103;
      local_120._24_4_ = -fVar117;
      local_120._28_4_ = -fVar156;
      auVar94 = vblendvps_avx(local_360,local_120,auVar104);
      auVar65 = vpmovsxwd_avx2(auVar80);
      local_220 = vblendvps_avx(auVar94,auVar14,auVar65);
      local_140._0_8_ = local_380._0_8_ ^ 0x8000000080000000;
      local_140._8_4_ = -fVar96;
      local_140._12_4_ = -fVar158;
      local_140._16_4_ = -fVar98;
      local_140._20_4_ = -fVar159;
      local_140._24_4_ = -fVar100;
      local_140._28_4_ = local_380._28_4_ ^ 0x80000000;
      auVar94 = vblendvps_avx(local_380,local_140,auVar104);
      local_200 = vblendvps_avx(auVar94,auVar15,auVar65);
      auVar64 = vfmadd132ps_fma(ZEXT1632(auVar19),auVar74,auVar74);
      auVar178 = ZEXT3264(local_3a0);
      local_2a0 = fVar116 * local_2a0;
      fStack_29c = fVar136 * fStack_29c;
      fStack_298 = fVar137 * fStack_298;
      fStack_294 = fVar138 * fStack_294;
      fStack_290 = fVar149 * fStack_290;
      fStack_28c = fVar152 * fStack_28c;
      fStack_288 = fVar153 * fStack_288;
      fStack_31c = fVar136 * fVar126;
      local_320 = fVar116 * fVar118;
      fStack_318 = fVar137 * fVar128;
      fStack_314 = fVar138 * fVar130;
      fStack_310 = fVar149 * fVar131;
      fStack_30c = fVar152 * fVar132;
      fStack_308 = fVar153 * fVar133;
      fStack_304 = -INFINITY;
      auVar77._0_4_ = fVar116 * fVar118 + fVar177 * (fVar160 + fVar79 * fVar150);
      auVar77._4_4_ = fVar136 * fVar126 + fVar179 * (fVar163 + fVar86 * fVar150);
      auVar77._8_4_ = fVar137 * fVar128 + fVar180 * (fVar164 + fVar87 * fVar150);
      auVar77._12_4_ = fVar138 * fVar130 + fVar181 * (fVar165 + fVar88 * fVar150);
      auVar77._16_4_ = fVar149 * fVar131 + (fVar166 + fVar89 * fVar150) * 0.0;
      auVar77._20_4_ = fVar152 * fVar132 + (fVar167 + fVar90 * fVar150) * 0.0;
      auVar77._24_4_ = fVar153 * fVar133 + (fVar168 + fVar91 * fVar150) * 0.0;
      auVar77._28_4_ = fStack_324 + fStack_84 + -INFINITY;
      auVar47._4_4_ = fVar172 * fStack_29c;
      auVar47._0_4_ = fVar169 * local_2a0;
      auVar47._8_4_ = fVar173 * fStack_298;
      auVar47._12_4_ = fVar174 * fStack_294;
      auVar47._16_4_ = fVar92 * fStack_290;
      auVar47._20_4_ = fVar95 * fStack_28c;
      auVar47._24_4_ = fVar97 * fStack_288;
      auVar47._28_4_ = fStack_284;
      auVar14 = vsubps_avx(auVar77,auVar47);
      local_160._0_8_ = local_3a0._0_8_ ^ 0x8000000080000000;
      local_160._8_4_ = -fVar137;
      local_160._12_4_ = -fVar138;
      local_160._16_4_ = -fVar149;
      local_160._20_4_ = -fVar152;
      local_160._24_4_ = -fVar153;
      local_160._28_4_ = local_3a0._28_4_ ^ 0x80000000;
      auVar94 = vblendvps_avx(local_3a0,local_160,auVar104);
      local_1e0 = vblendvps_avx(auVar94,auVar14,auVar65);
      auVar71._8_4_ = 0x3f800000;
      auVar71._0_8_ = &DAT_3f8000003f800000;
      auVar71._12_4_ = 0x3f800000;
      auVar71._16_4_ = 0x3f800000;
      auVar71._20_4_ = 0x3f800000;
      auVar71._24_4_ = 0x3f800000;
      auVar71._28_4_ = 0x3f800000;
      local_100 = vandnps_avx(auVar104,auVar71);
      _local_500 = ZEXT1632(auVar64);
      auVar48._4_4_ = fVar172 * auVar64._4_4_;
      auVar48._0_4_ = fVar169 * auVar64._0_4_;
      auVar48._8_4_ = fVar173 * auVar64._8_4_;
      auVar48._12_4_ = fVar174 * auVar64._12_4_;
      auVar48._16_4_ = fVar92 * 0.0;
      auVar48._20_4_ = fVar95 * 0.0;
      auVar48._24_4_ = fVar97 * 0.0;
      auVar48._28_4_ = auVar104._28_4_;
      local_280 = vblendvps_avx(local_100,auVar48,auVar65);
      local_240._0_4_ = fVar79 + local_3c0;
      local_240._4_4_ = fVar86 + fStack_3bc;
      local_240._8_4_ = fVar87 + fStack_3b8;
      local_240._12_4_ = fVar88 + fStack_3b4;
      local_240._16_4_ = fVar89 + 0.0;
      local_240._20_4_ = fVar90 + 0.0;
      local_240._24_4_ = fVar91 + 0.0;
      local_240._28_4_ = auVar78._28_4_ + fStack_3a4;
      local_260 = ZEXT832(0) << 0x20;
      auVar64 = vpsllw_avx(_local_2c0,0xf);
      auVar64 = vpacksswb_avx(auVar64,auVar64);
      uVar59 = (ulong)(byte)(SUB161(auVar64 >> 7,0) & 1 | (SUB161(auVar64 >> 0xf,0) & 1) << 1 |
                             (SUB161(auVar64 >> 0x17,0) & 1) << 2 |
                             (SUB161(auVar64 >> 0x1f,0) & 1) << 3 |
                             (SUB161(auVar64 >> 0x27,0) & 1) << 4 |
                             (SUB161(auVar64 >> 0x2f,0) & 1) << 5 |
                             (SUB161(auVar64 >> 0x37,0) & 1) << 6 | SUB161(auVar64 >> 0x3f,0) << 7);
      lVar58 = (long)(1 << ((uint)k & 0x1f)) * 0x10;
      auVar171 = ZEXT3264(local_580);
      auVar124 = ZEXT3264(local_360);
      auVar162 = ZEXT3264(local_380);
      fVar147 = fVar140;
      fVar79 = fVar140;
      fVar86 = fVar140;
      fVar87 = fVar140;
      fVar88 = fVar140;
      fVar116 = fVar140;
      fVar89 = fVar140;
      fVar90 = (float)local_540._0_4_;
      fVar136 = (float)local_540._4_4_;
      fVar91 = fStack_538;
      fVar96 = fStack_534;
      fVar137 = fStack_530;
      fVar158 = fStack_52c;
      fVar98 = fStack_528;
      fVar138 = fStack_524;
      fVar159 = (float)local_560._0_4_;
      fVar100 = (float)local_560._4_4_;
      fVar149 = fStack_558;
      fVar169 = fStack_554;
      fVar152 = fStack_550;
      fVar172 = fStack_54c;
      fVar153 = fStack_548;
      fVar173 = fStack_544;
      fVar156 = fStack_324;
      fVar174 = fVar150;
      fVar118 = fVar150;
      fVar92 = fVar150;
      fVar95 = fVar150;
      fVar126 = fVar150;
      fVar97 = fVar150;
      local_620 = k;
      local_618 = pSVar60;
      local_5a8 = line;
      local_520 = fVar150;
      fStack_51c = fVar150;
      fStack_518 = fVar150;
      fStack_514 = fVar150;
      fStack_510 = fVar150;
      fStack_50c = fVar150;
      fStack_508 = fVar150;
      fStack_504 = fVar150;
      do {
        local_610.valid = (int *)&local_630;
        uVar16 = 0;
        for (uVar57 = uVar59; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x8000000000000000) {
          uVar16 = uVar16 + 1;
        }
        local_430 = local_180[uVar16];
        pGVar12 = (pSVar60->geometries).items[local_430].ptr;
        if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          uVar59 = uVar59 ^ 1L << (uVar16 & 0x3f);
          bVar62 = true;
        }
        else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          bVar62 = false;
        }
        else {
          uVar57 = (ulong)(uint)((int)uVar16 * 4);
          local_3c0 = *(float *)(ray + k * 4 + 0x80);
          uVar1 = *(undefined4 *)(local_280 + uVar57);
          local_460._4_4_ = uVar1;
          local_460._0_4_ = uVar1;
          local_460._8_4_ = uVar1;
          local_460._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_260 + uVar57);
          local_450._4_4_ = uVar1;
          local_450._0_4_ = uVar1;
          local_450._8_4_ = uVar1;
          local_450._12_4_ = uVar1;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_240 + uVar57);
          local_610.context = context->user;
          uVar1 = *(undefined4 *)((long)&(local_5a8->primIDs).field_0 + uVar57);
          local_440._4_4_ = uVar1;
          local_440._0_4_ = uVar1;
          local_440._8_4_ = uVar1;
          local_440._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_220 + uVar57);
          local_490._4_4_ = uVar1;
          local_490._0_4_ = uVar1;
          local_490._8_4_ = uVar1;
          local_490._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_200 + uVar57);
          local_480._4_4_ = uVar1;
          local_480._0_4_ = uVar1;
          local_480._8_4_ = uVar1;
          local_480._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_1e0 + uVar57);
          local_470._4_4_ = uVar1;
          local_470._0_4_ = uVar1;
          local_470._8_4_ = uVar1;
          local_470._12_4_ = uVar1;
          vpcmpeqd_avx2(ZEXT1632(local_460),ZEXT1632(local_460));
          uStack_41c = (local_610.context)->instID[0];
          local_420 = uStack_41c;
          uStack_418 = uStack_41c;
          uStack_414 = uStack_41c;
          uStack_410 = (local_610.context)->instPrimID[0];
          uStack_40c = uStack_410;
          uStack_408 = uStack_410;
          uStack_404 = uStack_410;
          local_630 = *(undefined8 *)(mm_lookupmask_ps + lVar58);
          uStack_628 = *(undefined8 *)(mm_lookupmask_ps + lVar58 + 8);
          local_610.geometryUserPtr = pGVar12->userPtr;
          local_610.hit = local_490;
          local_610.N = 4;
          local_610.ray = (RTCRayN *)ray;
          uStack_42c = local_430;
          uStack_428 = local_430;
          uStack_424 = local_430;
          if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar12->occlusionFilterN)(&local_610);
            auVar171 = ZEXT3264(local_580);
            auVar178 = ZEXT3264(local_3a0);
            auVar162 = ZEXT3264(local_380);
            auVar124 = ZEXT3264(local_360);
            k = local_620;
            pSVar60 = local_618;
            fVar140 = (float)local_5e0._0_4_;
            fVar147 = (float)local_5e0._4_4_;
            fVar79 = fStack_5d8;
            fVar86 = fStack_5d4;
            fVar87 = fStack_5d0;
            fVar88 = fStack_5cc;
            fVar116 = fStack_5c8;
            fVar89 = fStack_5c4;
            fVar90 = (float)local_540._0_4_;
            fVar136 = (float)local_540._4_4_;
            fVar91 = fStack_538;
            fVar96 = fStack_534;
            fVar137 = fStack_530;
            fVar158 = fStack_52c;
            fVar98 = fStack_528;
            fVar138 = fStack_524;
            fVar159 = (float)local_560._0_4_;
            fVar100 = (float)local_560._4_4_;
            fVar149 = fStack_558;
            fVar169 = fStack_554;
            fVar152 = fStack_550;
            fVar172 = fStack_54c;
            fVar153 = fStack_548;
            fVar173 = fStack_544;
            fVar160 = (float)local_340._0_4_;
            fVar163 = (float)local_340._4_4_;
            fVar164 = fStack_338;
            fVar165 = fStack_334;
            fVar166 = fStack_330;
            fVar167 = fStack_32c;
            fVar168 = fStack_328;
            fVar156 = fStack_324;
            fVar150 = local_520;
            fVar174 = fStack_51c;
            fVar118 = fStack_518;
            fVar92 = fStack_514;
            fVar95 = fStack_510;
            fVar126 = fStack_50c;
            fVar97 = fStack_508;
          }
          auVar64._8_8_ = uStack_628;
          auVar64._0_8_ = local_630;
          if (auVar64 == (undefined1  [16])0x0) {
            auVar64 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
            auVar18 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
            auVar64 = auVar64 ^ auVar18;
          }
          else {
            p_Var13 = context->args->filter;
            if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var13)(&local_610);
              auVar171 = ZEXT3264(local_580);
              auVar178 = ZEXT3264(local_3a0);
              auVar162 = ZEXT3264(local_380);
              auVar124 = ZEXT3264(local_360);
              pSVar60 = local_618;
              fVar140 = (float)local_5e0._0_4_;
              fVar147 = (float)local_5e0._4_4_;
              fVar79 = fStack_5d8;
              fVar86 = fStack_5d4;
              fVar87 = fStack_5d0;
              fVar88 = fStack_5cc;
              fVar116 = fStack_5c8;
              fVar89 = fStack_5c4;
              fVar90 = (float)local_540._0_4_;
              fVar136 = (float)local_540._4_4_;
              fVar91 = fStack_538;
              fVar96 = fStack_534;
              fVar137 = fStack_530;
              fVar158 = fStack_52c;
              fVar98 = fStack_528;
              fVar138 = fStack_524;
              fVar159 = (float)local_560._0_4_;
              fVar100 = (float)local_560._4_4_;
              fVar149 = fStack_558;
              fVar169 = fStack_554;
              fVar152 = fStack_550;
              fVar172 = fStack_54c;
              fVar153 = fStack_548;
              fVar173 = fStack_544;
              fVar160 = (float)local_340._0_4_;
              fVar163 = (float)local_340._4_4_;
              fVar164 = fStack_338;
              fVar165 = fStack_334;
              fVar166 = fStack_330;
              fVar167 = fStack_32c;
              fVar168 = fStack_328;
              fVar156 = fStack_324;
              fVar150 = local_520;
              fVar174 = fStack_51c;
              fVar118 = fStack_518;
              fVar92 = fStack_514;
              fVar95 = fStack_510;
              fVar126 = fStack_50c;
              fVar97 = fStack_508;
            }
            auVar18._8_8_ = uStack_628;
            auVar18._0_8_ = local_630;
            auVar18 = vpcmpeqd_avx((undefined1  [16])0x0,auVar18);
            auVar64 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
            auVar64 = auVar18 ^ auVar64;
            auVar80._8_4_ = 0xff800000;
            auVar80._0_8_ = 0xff800000ff800000;
            auVar80._12_4_ = 0xff800000;
            auVar18 = vblendvps_avx(auVar80,*(undefined1 (*) [16])(local_610.ray + 0x80),auVar18);
            *(undefined1 (*) [16])(local_610.ray + 0x80) = auVar18;
          }
          auVar64 = vpslld_avx(auVar64,0x1f);
          bVar54 = (auVar64 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar55 = (auVar64 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar53 = (auVar64 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar63 = -1 < auVar64[0xf];
          bVar62 = ((bVar54 && bVar55) && bVar53) && bVar63;
          if (((bVar54 && bVar55) && bVar53) && bVar63) {
            *(float *)(ray + k * 4 + 0x80) = local_3c0;
            uVar59 = uVar59 ^ 1L << (uVar16 & 0x3f);
          }
        }
      } while ((uVar59 != 0) && (bVar62 != false));
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar72._4_4_ = uVar1;
      auVar72._0_4_ = uVar1;
      auVar72._8_4_ = uVar1;
      auVar72._12_4_ = uVar1;
      auVar72._16_4_ = uVar1;
      auVar72._20_4_ = uVar1;
      auVar72._24_4_ = uVar1;
      auVar72._28_4_ = uVar1;
      auVar18 = vpand_avx(local_4e0,local_4c0);
      auVar78 = vcmpps_avx(auVar171._0_32_,auVar72,2);
      auVar64 = vpackssdw_avx(auVar78._0_16_,auVar78._16_16_);
      auVar64 = vpand_avx(auVar64,auVar18);
      auVar78 = vpmovzxwd_avx2(auVar64);
      auVar78 = vpslld_avx2(auVar78,0x1f);
      if ((((((((auVar78 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar78 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar78 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar78 >> 0x7f,0) == '\0') &&
            (auVar78 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar78 >> 0xbf,0) == '\0') &&
          (auVar78 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar78[0x1f])
      {
        return (bool)(bVar62 ^ 1U);
      }
      auVar14 = vcmpps_avx(local_80,local_300,0);
      auVar78 = vblendvps_avx(auVar124._0_32_,local_120,auVar14);
      auVar94 = vblendvps_avx(auVar162._0_32_,local_140,auVar14);
      auVar14 = vblendvps_avx(auVar178._0_32_,local_160,auVar14);
      auVar15 = vcmpps_avx(local_80,local_2e0,0);
      auVar74 = vcmpps_avx(local_80,local_3e0,0);
      auVar15 = vorps_avx(auVar15,auVar74);
      fVar128 = local_80._0_4_;
      fVar99 = local_80._4_4_;
      fVar130 = local_80._8_4_;
      fVar101 = local_80._12_4_;
      fVar131 = local_80._16_4_;
      fVar102 = local_80._20_4_;
      fVar132 = local_80._24_4_;
      auVar109._0_4_ = (float)local_1c0._0_4_ * (fVar90 + fVar128 * fVar140) + local_5a0;
      auVar109._4_4_ = (float)local_1c0._4_4_ * (fVar136 + fVar99 * fVar147) + fStack_59c;
      auVar109._8_4_ = fStack_1b8 * (fVar91 + fVar130 * fVar79) + fStack_598;
      auVar109._12_4_ = fStack_1b4 * (fVar96 + fVar101 * fVar86) + fStack_594;
      auVar109._16_4_ = fStack_1b0 * (fVar137 + fVar131 * fVar87) + fStack_590;
      auVar109._20_4_ = fStack_1ac * (fVar158 + fVar102 * fVar88) + fStack_58c;
      auVar109._24_4_ = fStack_1a8 * (fVar98 + fVar132 * fVar116) + fStack_588;
      auVar109._28_4_ = fVar138 + auVar74._28_4_ + fStack_584;
      auVar115._0_4_ =
           (float)local_1c0._0_4_ * (fVar159 + fVar128 * (float)local_1a0._0_4_) + local_e0;
      auVar115._4_4_ =
           (float)local_1c0._4_4_ * (fVar100 + fVar99 * (float)local_1a0._4_4_) + fStack_dc;
      auVar115._8_4_ = fStack_1b8 * (fVar149 + fVar130 * fStack_198) + fStack_d8;
      auVar115._12_4_ = fStack_1b4 * (fVar169 + fVar101 * fStack_194) + fStack_d4;
      auVar115._16_4_ = fStack_1b0 * (fVar152 + fVar131 * fStack_190) + fStack_d0;
      auVar115._20_4_ = fStack_1ac * (fVar172 + fVar102 * fStack_18c) + fStack_cc;
      auVar115._24_4_ = fStack_1a8 * (fVar153 + fVar132 * fStack_188) + fStack_c8;
      auVar115._28_4_ = fVar173 + fVar89 + fStack_c4;
      auVar123._0_4_ = (float)local_1c0._0_4_ * (fVar160 + fVar150 * fVar128) + local_320;
      auVar123._4_4_ = (float)local_1c0._4_4_ * (fVar163 + fVar174 * fVar99) + fStack_31c;
      auVar123._8_4_ = fStack_1b8 * (fVar164 + fVar118 * fVar130) + fStack_318;
      auVar123._12_4_ = fStack_1b4 * (fVar165 + fVar92 * fVar101) + fStack_314;
      auVar123._16_4_ = fStack_1b0 * (fVar166 + fVar95 * fVar131) + fStack_310;
      auVar123._20_4_ = fStack_1ac * (fVar167 + fVar126 * fVar102) + fStack_30c;
      auVar123._24_4_ = fStack_1a8 * (fVar168 + fVar97 * fVar132) + fStack_308;
      auVar123._28_4_ = fVar156 + auVar124._28_4_ + fStack_304;
      fVar140 = local_400._0_4_;
      fVar147 = local_400._4_4_;
      auVar49._4_4_ = fVar147 * fStack_9c;
      auVar49._0_4_ = fVar140 * local_a0;
      fVar150 = local_400._8_4_;
      auVar49._8_4_ = fVar150 * fStack_98;
      fVar79 = local_400._12_4_;
      auVar49._12_4_ = fVar79 * fStack_94;
      fVar86 = local_400._16_4_;
      auVar49._16_4_ = fVar86 * fStack_90;
      fVar87 = local_400._20_4_;
      auVar49._20_4_ = fVar87 * fStack_8c;
      fVar88 = local_400._24_4_;
      auVar49._24_4_ = fVar88 * fStack_88;
      auVar49._28_4_ = uStack_1a4;
      auVar74 = vsubps_avx(auVar109,auVar49);
      local_220 = vblendvps_avx(auVar78,auVar74,auVar15);
      auVar50._4_4_ = fVar147 * fStack_bc;
      auVar50._0_4_ = fVar140 * local_c0;
      auVar50._8_4_ = fVar150 * fStack_b8;
      auVar50._12_4_ = fVar79 * fStack_b4;
      auVar50._16_4_ = fVar86 * fStack_b0;
      auVar50._20_4_ = fVar87 * fStack_ac;
      auVar50._24_4_ = fVar88 * fStack_a8;
      auVar50._28_4_ = auVar74._28_4_;
      auVar78 = vsubps_avx(auVar115,auVar50);
      local_200 = vblendvps_avx(auVar94,auVar78,auVar15);
      auVar51._4_4_ = fVar147 * fStack_29c;
      auVar51._0_4_ = fVar140 * local_2a0;
      auVar51._8_4_ = fVar150 * fStack_298;
      auVar51._12_4_ = fVar79 * fStack_294;
      auVar51._16_4_ = fVar86 * fStack_290;
      auVar51._20_4_ = fVar87 * fStack_28c;
      auVar51._24_4_ = fVar88 * fStack_288;
      auVar51._28_4_ = auVar78._28_4_;
      auVar78 = vsubps_avx(auVar123,auVar51);
      local_1e0 = vblendvps_avx(auVar14,auVar78,auVar15);
      auVar52._4_4_ = fVar147 * (float)local_500._4_4_;
      auVar52._0_4_ = fVar140 * (float)local_500._0_4_;
      auVar52._8_4_ = fVar150 * fStack_4f8;
      auVar52._12_4_ = fVar79 * fStack_4f4;
      auVar52._16_4_ = fVar86 * fStack_4f0;
      auVar52._20_4_ = fVar87 * fStack_4ec;
      auVar52._24_4_ = fVar88 * fStack_4e8;
      auVar52._28_4_ = auVar78._28_4_;
      local_280 = vblendvps_avx(local_100,auVar52,auVar15);
      local_260 = ZEXT832(0) << 0x20;
      local_240 = auVar171._0_32_;
      auVar61 = (undefined1  [8])context->scene;
      auVar64 = vpsllw_avx(auVar64,0xf);
      auVar64 = vpacksswb_avx(auVar64,auVar64);
      uVar59 = (ulong)(byte)(SUB161(auVar64 >> 7,0) & 1 | (SUB161(auVar64 >> 0xf,0) & 1) << 1 |
                             (SUB161(auVar64 >> 0x17,0) & 1) << 2 |
                             (SUB161(auVar64 >> 0x1f,0) & 1) << 3 |
                             (SUB161(auVar64 >> 0x27,0) & 1) << 4 |
                             (SUB161(auVar64 >> 0x2f,0) & 1) << 5 |
                             (SUB161(auVar64 >> 0x37,0) & 1) << 6 | SUB161(auVar64 >> 0x3f,0) << 7);
      lVar58 = (long)(1 << ((uint)k & 0x1f)) * 0x10;
      auVar78 = vpcmpeqd_avx2(auVar123,auVar123);
      auVar124 = ZEXT3264(auVar78);
      auVar162 = ZEXT464(0) << 0x20;
      auVar64 = vpcmpeqd_avx(local_400._0_16_,local_400._0_16_);
      auVar171 = ZEXT1664(auVar64);
      do {
        local_610.valid = (int *)&local_630;
        uVar16 = 0;
        for (uVar57 = uVar59; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x8000000000000000) {
          uVar16 = uVar16 + 1;
        }
        local_430 = local_180[uVar16];
        pGVar12 = (((Scene *)auVar61)->geometries).items[local_430].ptr;
        if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          uVar59 = uVar59 ^ 1L << (uVar16 & 0x3f);
          bVar63 = true;
        }
        else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          bVar63 = false;
        }
        else {
          uVar57 = (ulong)(uint)((int)uVar16 * 4);
          local_520 = *(float *)(ray + k * 4 + 0x80);
          uVar1 = *(undefined4 *)(local_280 + uVar57);
          local_460._4_4_ = uVar1;
          local_460._0_4_ = uVar1;
          local_460._8_4_ = uVar1;
          local_460._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_260 + uVar57);
          local_450._4_4_ = uVar1;
          local_450._0_4_ = uVar1;
          local_450._8_4_ = uVar1;
          local_450._12_4_ = uVar1;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_240 + uVar57);
          local_610.context = context->user;
          uVar1 = *(undefined4 *)((long)&(local_5a8->primIDs).field_0 + uVar57);
          local_440._4_4_ = uVar1;
          local_440._0_4_ = uVar1;
          local_440._8_4_ = uVar1;
          local_440._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_220 + uVar57);
          local_490._4_4_ = uVar1;
          local_490._0_4_ = uVar1;
          local_490._8_4_ = uVar1;
          local_490._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_200 + uVar57);
          local_480._4_4_ = uVar1;
          local_480._0_4_ = uVar1;
          local_480._8_4_ = uVar1;
          local_480._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_1e0 + uVar57);
          local_470._4_4_ = uVar1;
          local_470._0_4_ = uVar1;
          local_470._8_4_ = uVar1;
          local_470._12_4_ = uVar1;
          uStack_41c = (local_610.context)->instID[0];
          local_420 = uStack_41c;
          uStack_418 = uStack_41c;
          uStack_414 = uStack_41c;
          uStack_410 = (local_610.context)->instPrimID[0];
          uStack_40c = uStack_410;
          uStack_408 = uStack_410;
          uStack_404 = uStack_410;
          local_630 = *(undefined8 *)(mm_lookupmask_ps + lVar58);
          uStack_628 = *(undefined8 *)(mm_lookupmask_ps + lVar58 + 8);
          local_610.geometryUserPtr = pGVar12->userPtr;
          local_610.hit = local_490;
          local_610.N = 4;
          local_5e0 = auVar61;
          local_610.ray = (RTCRayN *)ray;
          uStack_42c = local_430;
          uStack_428 = local_430;
          uStack_424 = local_430;
          if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            local_540 = (undefined1  [8])ray;
            auVar78 = ZEXT1632(auVar124._0_16_);
            auVar64 = auVar171._0_16_;
            (*pGVar12->occlusionFilterN)(&local_610);
            auVar64 = vpcmpeqd_avx(auVar64,auVar64);
            auVar171 = ZEXT1664(auVar64);
            auVar162 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar78 = vpcmpeqd_avx2(auVar78,auVar78);
            auVar124 = ZEXT3264(auVar78);
            k = local_620;
            ray = (RayK<4> *)local_540;
            auVar61 = local_5e0;
          }
          auVar19._8_8_ = uStack_628;
          auVar19._0_8_ = local_630;
          auVar64 = auVar171._0_16_;
          if (auVar19 == (undefined1  [16])0x0) {
            auVar18 = vpcmpeqd_avx(auVar162._0_16_,(undefined1  [16])0x0);
            auVar64 = auVar64 ^ auVar18;
          }
          else {
            p_Var13 = context->args->filter;
            if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
              auVar78 = ZEXT1632(auVar124._0_16_);
              (*p_Var13)(&local_610);
              auVar64 = vpcmpeqd_avx(auVar64,auVar64);
              auVar171 = ZEXT1664(auVar64);
              auVar162 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar78 = vpcmpeqd_avx2(auVar78,auVar78);
              auVar124 = ZEXT3264(auVar78);
              k = local_620;
              auVar61 = local_5e0;
            }
            auVar17._8_8_ = uStack_628;
            auVar17._0_8_ = local_630;
            auVar18 = vpcmpeqd_avx(auVar162._0_16_,auVar17);
            auVar64 = auVar171._0_16_ ^ auVar18;
            auVar81._8_4_ = 0xff800000;
            auVar81._0_8_ = 0xff800000ff800000;
            auVar81._12_4_ = 0xff800000;
            auVar18 = vblendvps_avx(auVar81,*(undefined1 (*) [16])(local_610.ray + 0x80),auVar18);
            *(undefined1 (*) [16])(local_610.ray + 0x80) = auVar18;
          }
          auVar64 = vpslld_avx(auVar64,0x1f);
          bVar55 = (auVar64 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar56 = (auVar64 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar54 = (auVar64 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar53 = -1 < auVar64[0xf];
          bVar63 = ((bVar55 && bVar56) && bVar54) && bVar53;
          if (((bVar55 && bVar56) && bVar54) && bVar53) {
            *(float *)(ray + k * 4 + 0x80) = local_520;
            uVar59 = uVar59 ^ 1L << (uVar16 & 0x3f);
          }
        }
      } while ((uVar59 != 0) && (bVar63 != false));
      return (bool)(bVar62 ^ 1U | bVar63 ^ 1U);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom);
        const vbool<M> valid = line.valid();
        return ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Occluded1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }